

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

ON_SHA1_Hash * __thiscall
ON_MappingTag::Hash(ON_SHA1_Hash *__return_storage_ptr__,ON_MappingTag *this)

{
  ON_Xform *this_00;
  TYPE TVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uchar u;
  ON_SHA1 sha1;
  undefined1 local_a9;
  ON_SHA1 local_a8;
  
  TVar1 = this->m_mapping_type;
  if (TVar1 - plane_mapping < 8) {
    if (this->m_mapping_crc == 0) {
      bVar3 = ON_UuidIsNil(&this->m_mapping_id);
      if (bVar3) goto LAB_005107e0;
    }
    this_00 = &this->m_mesh_xform;
    bVar4 = ON_Xform::IsIdentity(this_00,2.3283064365386963e-10);
    bVar2 = true;
    bVar3 = true;
    if (bVar4) goto LAB_00510832;
    bVar4 = ON_Xform::IsZero(this_00);
    if (bVar4) goto LAB_00510832;
    bVar3 = ON_Xform::IsValid(this_00);
  }
  else {
    if (TVar1 == no_mapping) {
LAB_005107e0:
      local_a8.m_state[2] = 0;
      local_a8.m_state[3] = 0;
      local_a8.m_state[4] = 0;
      local_a8.m_bit_count[0] = 0;
      local_a8.m_bit_count[1] = 0;
      local_a8.m_state[0] = 0;
      local_a8.m_state[1] = 0;
      local_a8.m_buffer[0x30] = '\0';
      local_a8.m_buffer[0x31] = '\0';
      local_a8.m_buffer[0x32] = '\0';
      local_a8.m_buffer[0x33] = '\0';
      local_a8.m_buffer[0x34] = '\0';
      local_a8.m_buffer[0x35] = '\0';
      local_a8.m_buffer[0x36] = '\0';
      local_a8.m_buffer[0x37] = '\0';
      local_a8.m_buffer[0x38] = '\0';
      local_a8.m_buffer[0x39] = '\0';
      local_a8.m_buffer[0x3a] = '\0';
      local_a8.m_buffer[0x3b] = '\0';
      local_a8.m_buffer[0x3c] = '\0';
      local_a8.m_buffer[0x3d] = '\0';
      local_a8.m_buffer[0x3e] = '\0';
      local_a8.m_buffer[0x3f] = '\0';
      local_a8.m_buffer[0x20] = '\0';
      local_a8.m_buffer[0x21] = '\0';
      local_a8.m_buffer[0x22] = '\0';
      local_a8.m_buffer[0x23] = '\0';
      local_a8.m_buffer[0x24] = '\0';
      local_a8.m_buffer[0x25] = '\0';
      local_a8.m_buffer[0x26] = '\0';
      local_a8.m_buffer[0x27] = '\0';
      local_a8.m_buffer[0x28] = '\0';
      local_a8.m_buffer[0x29] = '\0';
      local_a8.m_buffer[0x2a] = '\0';
      local_a8.m_buffer[0x2b] = '\0';
      local_a8.m_buffer[0x2c] = '\0';
      local_a8.m_buffer[0x2d] = '\0';
      local_a8.m_buffer[0x2e] = '\0';
      local_a8.m_buffer[0x2f] = '\0';
      local_a8.m_buffer[0x10] = '\0';
      local_a8.m_buffer[0x11] = '\0';
      local_a8.m_buffer[0x12] = '\0';
      local_a8.m_buffer[0x13] = '\0';
      local_a8.m_buffer[0x14] = '\0';
      local_a8.m_buffer[0x15] = '\0';
      local_a8.m_buffer[0x16] = '\0';
      local_a8.m_buffer[0x17] = '\0';
      local_a8.m_buffer[0x18] = '\0';
      local_a8.m_buffer[0x19] = '\0';
      local_a8.m_buffer[0x1a] = '\0';
      local_a8.m_buffer[0x1b] = '\0';
      local_a8.m_buffer[0x1c] = '\0';
      local_a8.m_buffer[0x1d] = '\0';
      local_a8.m_buffer[0x1e] = '\0';
      local_a8.m_buffer[0x1f] = '\0';
      local_a8.m_buffer[0] = '\0';
      local_a8.m_buffer[1] = '\0';
      local_a8.m_buffer[2] = '\0';
      local_a8.m_buffer[3] = '\0';
      local_a8.m_buffer[4] = '\0';
      local_a8.m_buffer[5] = '\0';
      local_a8.m_buffer[6] = '\0';
      local_a8.m_buffer[7] = '\0';
      local_a8.m_buffer[8] = '\0';
      local_a8.m_buffer[9] = '\0';
      local_a8.m_buffer[10] = '\0';
      local_a8.m_buffer[0xb] = '\0';
      local_a8.m_buffer[0xc] = '\0';
      local_a8.m_buffer[0xd] = '\0';
      local_a8.m_buffer[0xe] = '\0';
      local_a8.m_buffer[0xf] = '\0';
      local_a8.m_byte_count = 0;
      local_a8.m_status_bits = 0;
      local_a8.m_reserved = 0;
      ON_SHA1_Hash::ON_SHA1_Hash(&local_a8.m_sha1_hash);
      goto LAB_005108ae;
    }
    if (TVar1 == srfp_mapping) {
      bVar3 = false;
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                 ,0x3483,"","Invalid m_mapping_type value.");
      bVar3 = false;
    }
LAB_00510832:
    bVar2 = bVar3;
    bVar3 = false;
  }
  local_a8.m_state[2] = 0;
  local_a8.m_state[3] = 0;
  local_a8.m_state[4] = 0;
  local_a8.m_bit_count[0] = 0;
  local_a8.m_bit_count[1] = 0;
  local_a8.m_state[0] = 0;
  local_a8.m_state[1] = 0;
  local_a8.m_buffer[0x30] = '\0';
  local_a8.m_buffer[0x31] = '\0';
  local_a8.m_buffer[0x32] = '\0';
  local_a8.m_buffer[0x33] = '\0';
  local_a8.m_buffer[0x34] = '\0';
  local_a8.m_buffer[0x35] = '\0';
  local_a8.m_buffer[0x36] = '\0';
  local_a8.m_buffer[0x37] = '\0';
  local_a8.m_buffer[0x38] = '\0';
  local_a8.m_buffer[0x39] = '\0';
  local_a8.m_buffer[0x3a] = '\0';
  local_a8.m_buffer[0x3b] = '\0';
  local_a8.m_buffer[0x3c] = '\0';
  local_a8.m_buffer[0x3d] = '\0';
  local_a8.m_buffer[0x3e] = '\0';
  local_a8.m_buffer[0x3f] = '\0';
  local_a8.m_buffer[0x20] = '\0';
  local_a8.m_buffer[0x21] = '\0';
  local_a8.m_buffer[0x22] = '\0';
  local_a8.m_buffer[0x23] = '\0';
  local_a8.m_buffer[0x24] = '\0';
  local_a8.m_buffer[0x25] = '\0';
  local_a8.m_buffer[0x26] = '\0';
  local_a8.m_buffer[0x27] = '\0';
  local_a8.m_buffer[0x28] = '\0';
  local_a8.m_buffer[0x29] = '\0';
  local_a8.m_buffer[0x2a] = '\0';
  local_a8.m_buffer[0x2b] = '\0';
  local_a8.m_buffer[0x2c] = '\0';
  local_a8.m_buffer[0x2d] = '\0';
  local_a8.m_buffer[0x2e] = '\0';
  local_a8.m_buffer[0x2f] = '\0';
  local_a8.m_buffer[0x10] = '\0';
  local_a8.m_buffer[0x11] = '\0';
  local_a8.m_buffer[0x12] = '\0';
  local_a8.m_buffer[0x13] = '\0';
  local_a8.m_buffer[0x14] = '\0';
  local_a8.m_buffer[0x15] = '\0';
  local_a8.m_buffer[0x16] = '\0';
  local_a8.m_buffer[0x17] = '\0';
  local_a8.m_buffer[0x18] = '\0';
  local_a8.m_buffer[0x19] = '\0';
  local_a8.m_buffer[0x1a] = '\0';
  local_a8.m_buffer[0x1b] = '\0';
  local_a8.m_buffer[0x1c] = '\0';
  local_a8.m_buffer[0x1d] = '\0';
  local_a8.m_buffer[0x1e] = '\0';
  local_a8.m_buffer[0x1f] = '\0';
  local_a8.m_buffer[0] = '\0';
  local_a8.m_buffer[1] = '\0';
  local_a8.m_buffer[2] = '\0';
  local_a8.m_buffer[3] = '\0';
  local_a8.m_buffer[4] = '\0';
  local_a8.m_buffer[5] = '\0';
  local_a8.m_buffer[6] = '\0';
  local_a8.m_buffer[7] = '\0';
  local_a8.m_buffer[8] = '\0';
  local_a8.m_buffer[9] = '\0';
  local_a8.m_buffer[10] = '\0';
  local_a8.m_buffer[0xb] = '\0';
  local_a8.m_buffer[0xc] = '\0';
  local_a8.m_buffer[0xd] = '\0';
  local_a8.m_buffer[0xe] = '\0';
  local_a8.m_buffer[0xf] = '\0';
  local_a8.m_byte_count = 0;
  local_a8.m_status_bits = 0;
  local_a8.m_reserved = 0;
  ON_SHA1_Hash::ON_SHA1_Hash(&local_a8.m_sha1_hash);
  local_a9 = (undefined1)this->m_mapping_type;
  ON_SHA1::AccumulateBytes(&local_a8,&local_a9,1);
  if (bVar2) {
    ON_SHA1::AccumulateId(&local_a8,&this->m_mapping_id);
    ON_SHA1::AccumulateInteger32(&local_a8,this->m_mapping_crc);
  }
  if (bVar3 != false) {
    ON_SHA1::AccumulateTransformation(&local_a8,&this->m_mesh_xform);
  }
LAB_005108ae:
  ON_SHA1::Hash(__return_storage_ptr__,&local_a8);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_MappingTag::Hash() const
{
  bool bHashType = true;
  bool bHashIdAndCRC = false;
  bool bHashXform = false;
  switch (m_mapping_type)
  {
  case ON_TextureMapping::TYPE::no_mapping:
    bHashType = false;
    break;
  case ON_TextureMapping::TYPE::srfp_mapping:
    break;
  case ON_TextureMapping::TYPE::plane_mapping:
  case ON_TextureMapping::TYPE::cylinder_mapping:
  case ON_TextureMapping::TYPE::sphere_mapping:
  case ON_TextureMapping::TYPE::box_mapping:
  case ON_TextureMapping::TYPE::mesh_mapping_primitive:
  case ON_TextureMapping::TYPE::srf_mapping_primitive:
  case ON_TextureMapping::TYPE::brep_mapping_primitive:
  case ON_TextureMapping::TYPE::ocs_mapping:
    if (IsSet())
    {
      bHashIdAndCRC = true;
      if (false == m_mesh_xform.IsIdentity(ON_ZERO_TOLERANCE) && false == m_mesh_xform.IsZero() && m_mesh_xform.IsValid())
        bHashXform = true;
    }
    else
      bHashType = false; // bogus mapping - treat as unset 
    break;
  default:
    // Perhaps somebody added a value to the enum after June 2020 and failed to update this code?
    ON_ERROR("Invalid m_mapping_type value.");
    break;
  }

  ON_SHA1 sha1;
  if (bHashType)
  {
    const unsigned char u = (unsigned char)m_mapping_type;
    sha1.AccumulateBytes(&u,1);
  }
  if (bHashIdAndCRC)
  {
    sha1.AccumulateId(m_mapping_id);
    sha1.AccumulateInteger32(m_mapping_crc);
  }
  if (bHashXform)
  {
    sha1.AccumulateTransformation(m_mesh_xform);
  }
  return sha1.Hash();
}